

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::get_srv_config_all
          (raft_server *this,
          vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
          *configs_out)

{
  iterator __end1;
  _func_int **pp_Var1;
  ptr<cluster_config> c_conf;
  _func_int **local_28;
  element_type *local_20;
  
  get_config((raft_server *)&stack0xffffffffffffffd8);
  pp_Var1 = local_28 + 7;
  while (pp_Var1 = (_func_int **)*pp_Var1, pp_Var1 != local_28 + 7) {
    std::
    vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::push_back(configs_out,(value_type *)(pp_Var1 + 2));
  }
  if (local_20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    return;
  }
  return;
}

Assistant:

void raft_server::get_srv_config_all
     ( std::vector< ptr<srv_config> >& configs_out ) const
{
    ptr<cluster_config> c_conf = get_config();
    auto& servers = c_conf->get_servers();
    for (auto& entry: servers) configs_out.push_back(entry);
}